

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gritlm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string response;
  string prompt;
  float cosine_sim_q1_d1;
  float cosine_sim_q1_d0;
  float cosine_sim_q0_d1;
  float cosine_sim_q0_d0;
  int n_embd;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  q_rep;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  d_rep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  documents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  string instruction;
  llama_sampler *smpl;
  llama_sampler_chain_params sparams;
  llama_context *ctx;
  llama_model *model;
  llama_context_params cparams;
  llama_model_params mparams;
  common_params params;
  undefined4 in_stack_ffffffffffffe6b0;
  undefined4 in_stack_ffffffffffffe6b4;
  undefined4 in_stack_ffffffffffffe6c0;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffe6c4;
  undefined4 uVar7;
  undefined4 uVar8;
  int n;
  undefined4 uVar9;
  undefined4 uVar10;
  iterator embd1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *instruction_00;
  string *local_17e0;
  string *local_17a0;
  undefined1 *puVar11;
  undefined1 stream;
  string *prompt_00;
  llama_sampler *smpl_00;
  llama_context *ctx_00;
  string local_1720 [39];
  allocator<char> local_16f9;
  string local_16f8 [36];
  float local_16d4;
  float local_16d0;
  float local_16cc;
  float local_16c8;
  undefined4 local_16c4;
  string local_16c0 [24];
  string *in_stack_ffffffffffffe958;
  pointer in_stack_ffffffffffffe960;
  llama_context *in_stack_ffffffffffffe968;
  allocator<char> local_1681;
  string local_1680 [32];
  string local_1660 [32];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1640;
  undefined1 local_1623;
  allocator<char> local_1622;
  allocator<char> local_1621;
  string *local_1620;
  string local_1618 [32];
  undefined1 local_15f8 [32];
  string *local_15d8;
  undefined8 local_15d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15c8;
  undefined1 local_15ab;
  undefined1 local_15aa [2];
  llama_sampler *local_15a8;
  llama_sampler local_15a0 [32];
  undefined1 local_1580 [32];
  llama_sampler *local_1560;
  undefined8 local_1558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1550;
  allocator<char> local_1531;
  string local_1530 [39];
  undefined1 local_1509;
  undefined8 local_1508;
  undefined1 local_14f9;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  iterator local_14b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_14b0;
  string *local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 local_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 local_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  iterator local_13e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_13e0;
  string *local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined4 local_1368;
  undefined8 in_stack_fffffffffffffa40;
  llama_example in_stack_fffffffffffffa4c;
  common_params *in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  int local_4;
  
  common_params::common_params((common_params *)&stack0xffffffffffffeca8);
  bVar3 = common_params_parse(in_stack_fffffffffffffa60,(char **)in_stack_fffffffffffffa58,
                              in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                              (_func_void_int_char_ptr_ptr *)in_stack_fffffffffffffa40);
  if (bVar3) {
    common_init();
    common_model_params_to_llama
              ((common_params *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
    common_context_params_to_llama
              ((common_params *)CONCAT44(in_stack_ffffffffffffe6c4,in_stack_ffffffffffffe6c0));
    llama_backend_init();
    uVar4 = std::__cxx11::string::c_str();
    local_1438 = local_1370;
    local_1448 = local_1380;
    uStack_1440 = uStack_1378;
    local_1458 = local_1390;
    uStack_1450 = uStack_1388;
    local_1468 = local_13a0;
    uStack_1460 = uStack_1398;
    local_1478 = local_13b0;
    uStack_1470 = uStack_13a8;
    local_1430 = llama_model_load_from_file(uVar4);
    local_1488 = local_13b8;
    local_1498 = local_13c8;
    uStack_1490 = uStack_13c0;
    local_14a8 = local_13d8;
    uStack_14a0 = uStack_13d0;
    local_14b8 = local_13e8;
    pbStack_14b0 = pbStack_13e0;
    local_14c8 = local_13f8;
    uVar1 = local_14c8;
    uStack_14c0 = uStack_13f0;
    uVar2 = uStack_14c0;
    local_14d8 = local_1408;
    uStack_14d0 = uStack_1400;
    local_14e8 = local_1418;
    uStack_14e0 = uStack_1410;
    uVar5 = uStack_14e0;
    local_14f8 = local_1428;
    uStack_14f0 = uStack_1420;
    uVar4 = uStack_14f0;
    uStack_14f0._0_4_ = (undefined4)uStack_1420;
    uStack_14f0._4_4_ = (undefined4)((ulong)uStack_1420 >> 0x20);
    uStack_14e0._0_4_ = (undefined4)uStack_1410;
    uStack_14e0._4_4_ = (undefined4)((ulong)uStack_1410 >> 0x20);
    local_14c8._0_4_ = (undefined4)local_13f8;
    local_14c8._4_4_ = (int)((ulong)local_13f8 >> 0x20);
    uStack_14c0._0_4_ = (undefined4)uStack_13f0;
    uStack_14c0._4_4_ = (undefined4)((ulong)uStack_13f0 >> 0x20);
    in_stack_ffffffffffffe6b0 = (undefined4)uStack_14f0;
    in_stack_ffffffffffffe6b4 = uStack_14f0._4_4_;
    uVar6 = (undefined4)uStack_14e0;
    uVar7 = uStack_14e0._4_4_;
    uVar8 = (undefined4)local_14c8;
    n = local_14c8._4_4_;
    uVar9 = (undefined4)uStack_14c0;
    uVar10 = uStack_14c0._4_4_;
    uStack_14f0 = uVar4;
    uStack_14e0 = uVar5;
    local_14c8 = uVar1;
    uStack_14c0 = uVar2;
    local_1480 = llama_init_from_model(local_1430);
    llama_sampler_chain_default_params();
    local_14f9 = 0;
    local_1509 = 0;
    uVar4 = llama_sampler_chain_init(0);
    local_1508 = uVar4;
    uVar5 = llama_sampler_init_greedy();
    llama_sampler_chain_add(uVar4,uVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbStack_13e0,(char *)local_13e8,(allocator<char> *)CONCAT44(uVar10,uVar9));
    std::allocator<char>::~allocator(&local_1531);
    local_15ab = 1;
    smpl_00 = local_15a0;
    ctx_00 = (llama_context *)(local_15aa + 1);
    local_15a8 = smpl_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbStack_13e0,(char *)local_13e8,(allocator<char> *)CONCAT44(uVar10,uVar9));
    puVar11 = local_1580;
    prompt_00 = (string *)local_15aa;
    local_15a8 = (llama_sampler *)puVar11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbStack_13e0,(char *)local_13e8,(allocator<char> *)CONCAT44(uVar10,uVar9));
    local_15ab = 0;
    local_1560 = local_15a0;
    local_1558 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x177531);
    __l._M_len = (size_type)pbStack_13e0;
    __l._M_array = local_13e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(uVar10,uVar9),__l,(allocator_type *)CONCAT44(n,uVar8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x177565);
    local_17a0 = (string *)&local_1560;
    embd1 = local_13e8;
    this = pbStack_13e0;
    instruction_00 = local_13d8;
    do {
      local_17a0 = local_17a0 + -0x20;
      std::__cxx11::string::~string(local_17a0);
    } while (local_17a0 != (string *)local_15a0);
    std::allocator<char>::~allocator((allocator<char> *)local_15aa);
    std::allocator<char>::~allocator((allocator<char> *)(local_15aa + 1));
    local_1623 = 1;
    local_1620 = local_1618;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)embd1,(allocator<char> *)CONCAT44(uVar10,uVar9));
    local_1620 = (string *)local_15f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)embd1,(allocator<char> *)CONCAT44(uVar10,uVar9));
    local_1623 = 0;
    local_15d8 = local_1618;
    local_15d0 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1776a8);
    __l_00._M_len = (size_type)this;
    __l_00._M_array = embd1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(uVar10,uVar9),__l_00,(allocator_type *)CONCAT44(n,uVar8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1776dc);
    local_17e0 = (string *)&local_15d8;
    do {
      local_17e0 = local_17e0 + -0x20;
      std::__cxx11::string::~string(local_17e0);
      stream = (undefined1)((ulong)puVar11 >> 0x38);
    } while (local_17e0 != local_1618);
    std::allocator<char>::~allocator(&local_1622);
    std::allocator<char>::~allocator(&local_1621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)embd1,(allocator<char> *)CONCAT44(uVar10,uVar9));
    gritlm_instruction(instruction_00);
    encode(in_stack_ffffffffffffe968,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe960,in_stack_ffffffffffffe958);
    std::__cxx11::string::~string(local_1660);
    std::__cxx11::string::~string(local_1680);
    std::allocator<char>::~allocator(&local_1681);
    gritlm_instruction(instruction_00);
    encode(in_stack_ffffffffffffe968,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe960,in_stack_ffffffffffffe958);
    std::__cxx11::string::~string(local_16c0);
    local_16c4 = llama_model_n_embd(local_1430);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)&stack0xffffffffffffe960,0);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x177890);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[](&local_1640,0);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x1778b5);
    local_16c8 = common_embd_similarity_cos((float *)embd1,(float *)CONCAT44(uVar10,uVar9),n);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)&stack0xffffffffffffe960,0);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x177902);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[](&local_1640,1);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x177924);
    local_16cc = common_embd_similarity_cos((float *)embd1,(float *)CONCAT44(uVar10,uVar9),n);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)&stack0xffffffffffffe960,1);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x177972);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[](&local_1640,0);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x177993);
    local_16d0 = common_embd_similarity_cos((float *)embd1,(float *)CONCAT44(uVar10,uVar9),n);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)&stack0xffffffffffffe960,1);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x1779e9);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[](&local_1640,1);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x177a0e);
    local_16d4 = common_embd_similarity_cos((float *)embd1,(float *)CONCAT44(uVar10,uVar9),n);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_1550,0);
    uVar4 = std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_15c8,0);
    uVar5 = std::__cxx11::string::c_str();
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_16c8,0),uVar4,uVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_1550,0);
    uVar4 = std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_15c8,1);
    uVar5 = std::__cxx11::string::c_str();
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_16cc,0),uVar4,uVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_1550,1);
    uVar4 = std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_15c8,0);
    uVar5 = std::__cxx11::string::c_str();
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_16d0,0),uVar4,uVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_1550,1);
    uVar4 = std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_15c8,1);
    uVar5 = std::__cxx11::string::c_str();
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_16d4,0),uVar4,uVar5);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)CONCAT44(uVar7,uVar6));
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)CONCAT44(uVar7,uVar6));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(uVar7,uVar6));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(uVar7,uVar6));
    std::__cxx11::string::~string(local_1530);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)embd1,(allocator<char> *)CONCAT44(uVar10,uVar9));
    std::allocator<char>::~allocator(&local_16f9);
    generate(ctx_00,smpl_00,prompt_00,(bool)stream);
    std::__cxx11::string::~string(local_1720);
    std::__cxx11::string::~string(local_16f8);
    llama_sampler_free(local_1508);
    llama_free(local_1480);
    llama_model_free(local_1430);
    llama_backend_free();
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  local_1368 = 1;
  common_params::~common_params
            ((common_params *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
  return local_4;
}

Assistant:

int main(int argc, char * argv[]) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_COMMON)) {
        return 1;
    }

    common_init();

    llama_model_params mparams = common_model_params_to_llama(params);
    llama_context_params cparams = common_context_params_to_llama(params);

    llama_backend_init();

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), mparams);

    // create generation context
    llama_context * ctx = llama_init_from_model(model, cparams);

    auto sparams = llama_sampler_chain_default_params();

    sparams.no_perf = false;

    llama_sampler * smpl = llama_sampler_chain_init(sparams);

    llama_sampler_chain_add(smpl, llama_sampler_init_greedy());

    // ### Embedding/Representation ###
    // samples taken from: https://github.com/ContextualAI/gritlm#basic
    {
        const std::string instruction = "Given a scientific paper title, retrieve the paper's abstract";

        const std::vector<std::string> queries = {
            "Bitcoin: A Peer-to-Peer Electronic Cash System",
            "Generative Representational Instruction Tuning",
        };

        const std::vector<std::string> documents = {
            "A purely peer-to-peer version of electronic cash would allow online payments to be sent directly from one party to another without going through a financial institution. Digital signatures provide part of the solution, but the main benefits are lost if a trusted third party is still required to prevent double-spending. We propose a solution to the double-spending problem using a peer-to-peer network. The network timestamps transactions by hashing them into an ongoing chain of hash-based proof-of-work, forming a record that cannot be changed without redoing the proof-of-work. The longest chain not only serves as proof of the sequence of events witnessed, but proof that it came from the largest pool of CPU power. As long as a majority of CPU power is controlled by nodes that are not cooperating to attack the network, they'll generate the longest chain and outpace attackers. The network itself requires minimal structure. Messages are broadcast on a best effort basis, and nodes can leave and rejoin the network at will, accepting the longest proof-of-work chain as proof of what happened while they were gone.",
            "All text-based language problems can be reduced to either generation or embedding. Current models only perform well at one or the other. We introduce generative representational instruction tuning (GRIT) whereby a large language model is trained to handle both generative and embedding tasks by distinguishing between them through instructions. Compared to other open models, our resulting GritLM 7B sets a new state of the art on the Massive Text Embedding Benchmark (MTEB) and outperforms all models up to its size on a range of generative tasks. By scaling up further, GritLM 8X7B outperforms all open generative language models that we tried while still being among the best embedding models. Notably, we find that GRIT matches training on only generative or embedding data, thus we can unify both at no performance loss. Among other benefits, the unification via GRIT speeds up Retrieval-Augmented Generation (RAG) by > 60% for long documents, by no longer requiring separate retrieval and generation models. Models, code, etc. are freely available at https://github.com/ContextualAI/gritlm.",
        };

        // No need to add instruction for retrieval documents
        const std::vector<std::vector<float>> d_rep = encode(ctx, documents, gritlm_instruction(""));
        const std::vector<std::vector<float>> q_rep = encode(ctx, queries,   gritlm_instruction(instruction));

        const int n_embd = llama_model_n_embd(model);

        const float cosine_sim_q0_d0 = common_embd_similarity_cos(q_rep[0].data(), d_rep[0].data(), n_embd);
        const float cosine_sim_q0_d1 = common_embd_similarity_cos(q_rep[0].data(), d_rep[1].data(), n_embd);
        const float cosine_sim_q1_d0 = common_embd_similarity_cos(q_rep[1].data(), d_rep[0].data(), n_embd);
        const float cosine_sim_q1_d1 = common_embd_similarity_cos(q_rep[1].data(), d_rep[1].data(), n_embd);

        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[0].c_str(), documents[0].c_str(), cosine_sim_q0_d0);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[0].c_str(), documents[1].c_str(), cosine_sim_q0_d1);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[1].c_str(), documents[0].c_str(), cosine_sim_q1_d0);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[1].c_str(), documents[1].c_str(), cosine_sim_q1_d1);
    }

    // ### Generation ###
    // GritLM models are not finetuned with system prompts, as you can just include system-like instructions together with your user instruction
    {
        const std::string prompt = "<|user|>\nPlease write me a poem about my recent hike of Mt. Fuji at midnight in the style of Shakespeare.\n<|assistant|>\n";
        std::string response = generate(ctx, smpl, prompt, true);
    }

    llama_sampler_free(smpl);
    llama_free(ctx);
    llama_model_free(model);
    llama_backend_free();

    return 0;
}